

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

int __thiscall
deqp::RobustBufferAccessBehaviorTests::init(RobustBufferAccessBehaviorTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  TexelFetchTest *this_00;
  StorageBufferTest *this_01;
  UniformBufferTest *this_02;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  RobustBufferAccessBehavior::VertexBufferObjectsTest::VertexBufferObjectsTest
            ((VertexBufferObjectsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (TexelFetchTest *)operator_new(0x80);
  RobustBufferAccessBehavior::TexelFetchTest::TexelFetchTest
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar1 = (TestNode *)operator_new(0x80);
  RobustBufferAccessBehavior::ImageLoadStoreTest::ImageLoadStoreTest
            ((ImageLoadStoreTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_01 = (StorageBufferTest *)operator_new(0x80);
  RobustBufferAccessBehavior::StorageBufferTest::StorageBufferTest
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (UniformBufferTest *)operator_new(0x80);
  RobustBufferAccessBehavior::UniformBufferTest::UniformBufferTest
            (this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  return extraout_EAX;
}

Assistant:

void RobustBufferAccessBehaviorTests::init(void)
{
	addChild(new RobustBufferAccessBehavior::VertexBufferObjectsTest(m_context));
	addChild(new RobustBufferAccessBehavior::TexelFetchTest(m_context));
	addChild(new RobustBufferAccessBehavior::ImageLoadStoreTest(m_context));
	addChild(new RobustBufferAccessBehavior::StorageBufferTest(m_context));
	addChild(new RobustBufferAccessBehavior::UniformBufferTest(m_context));
}